

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void usageMessage(ostream *stream,char *program_name,bool verbose)

{
  size_t sVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"Usage: ",7);
  if (program_name == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar1 = strlen(program_name);
    std::__ostream_insert<char,std::char_traits<char>>(stream,program_name,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," [options] infile outfile",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
  std::ostream::put((char)stream);
  std::ostream::flush();
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              (stream,
               "\nRead an OpenEXR image from infile, generate a preview\nimage, add it to the image\'s header, and save the result\nin outfile.  Infile and outfile must not refer to the same\nfile (the program cannot edit an image file \"in place\").\n\nOptions:\n\n  -w x          sets the width of the preview image to x pixels\n                (default is 100)\n\n  -e s          adjusts the preview image\'s exposure by s f-stops\n                (default is 0).  Positive values make the image\n                brighter, negative values make it darker.\n\n  -v            verbose mode\n\n  -h, --help    print this message\n\n      --version print version information\n\nReport bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
               ,0x2e5);
    return;
  }
  return;
}

Assistant:

void
usageMessage (ostream& stream, const char* program_name, bool verbose = false)
{
    stream << "Usage: " << program_name << " [options] infile outfile" << endl;

    if (verbose)
        stream << "\n"
            "Read an OpenEXR image from infile, generate a preview\n"
            "image, add it to the image's header, and save the result\n"
            "in outfile.  Infile and outfile must not refer to the same\n"
            "file (the program cannot edit an image file \"in place\").\n"
            "\n"
            "Options:\n"
            "\n"
            "  -w x          sets the width of the preview image to x pixels\n"
            "                (default is 100)\n"
            "\n"
            "  -e s          adjusts the preview image's exposure by s f-stops\n"
            "                (default is 0).  Positive values make the image\n"
            "                brighter, negative values make it darker.\n"
            "\n"
            "  -v            verbose mode\n"
            "\n"
            "  -h, --help    print this message\n"
            "\n"
            "      --version print version information\n"
            "\n"
            "Report bugs via https://github.com/AcademySoftwareFoundation/openexr/issues or email security@openexr.com\n"
            "";
}